

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O1

bool __thiscall
StringKMerFactoryNC::create_kmers
          (StringKMerFactoryNC *this,string *s,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *mers)

{
  uint64_t *__args;
  int64_t *piVar1;
  byte bVar2;
  iterator __position;
  long lVar3;
  ulong uVar4;
  
  (this->super_KMerFactory).last_unknown = 0;
  (this->super_KMerFactory).fkmer = 0;
  (this->super_KMerFactory).rkmer = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (mers,((long)(mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)(mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                         _M_impl.super__Vector_impl_data._M_start >> 3) + s->_M_string_length);
  if (s->_M_string_length != 0) {
    __args = &(this->super_KMerFactory).fkmer;
    uVar4 = 0;
    do {
      bVar2 = (s->_M_dataplus)._M_p[uVar4];
      lVar3 = (long)(this->super_KMerFactory).b2f._M_elems[bVar2];
      if (lVar3 == 4) {
        (this->super_KMerFactory).last_unknown = 0;
        (this->super_KMerFactory).rkmer =
             (this->super_KMerFactory).rkmer << 2 & (this->super_KMerFactory).KMER_MASK;
        (this->super_KMerFactory).fkmer =
             (3L << ((byte)(this->super_KMerFactory).KMER_FIRSTOFFSET & 0x3f)) +
             ((this->super_KMerFactory).fkmer >> 2);
      }
      else {
        (this->super_KMerFactory).rkmer =
             lVar3 + (this->super_KMerFactory).rkmer * 4 & (this->super_KMerFactory).KMER_MASK;
        (this->super_KMerFactory).fkmer =
             ((long)(this->super_KMerFactory).b2r._M_elems[bVar2] <<
             ((byte)(this->super_KMerFactory).KMER_FIRSTOFFSET & 0x3f)) +
             ((this->super_KMerFactory).fkmer >> 2);
        piVar1 = &(this->super_KMerFactory).last_unknown;
        *piVar1 = *piVar1 + 1;
      }
      if ((long)(ulong)(this->super_KMerFactory).K <= (this->super_KMerFactory).last_unknown) {
        __position._M_current =
             (mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)mers,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          (mers->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < s->_M_string_length);
  }
  return false;
}

Assistant:

const bool create_kmers(const std::string &s, std::vector<uint64_t> &mers) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        mers.reserve(mers.size()+s.size());
        while (p < s.size()) {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                mers.emplace_back(fkmer);
            }
        }
        return false;
    }